

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall QSettings::endGroup(QSettings *this)

{
  bool bVar1;
  QSettingsPrivate *pQVar2;
  ulong uVar3;
  qsizetype qVar4;
  __off_t __length;
  long in_FS_OFFSET;
  qsizetype len;
  QSettingsPrivate *d;
  QSettingsGroup group;
  QStack<QSettingsGroup> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QString *in_stack_ffffffffffffff30;
  QSettingsGroup *in_stack_ffffffffffffff50;
  QMessageLogger local_90;
  QString local_70;
  QSettingsGroup local_58;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSettings *)0x7b255b);
  bVar1 = QList<QSettingsGroup>::isEmpty((QList<QSettingsGroup> *)0x7b2571);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff30,
               (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff24,(char *)in_stack_ffffffffffffff18);
    QMessageLogger::warning(&local_28,"QSettings::endGroup: No matching beginGroup()");
  }
  else {
    local_58.str.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.str.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.str.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack<QSettingsGroup>::pop(in_stack_ffffffffffffff18);
    QSettingsGroup::toString(in_stack_ffffffffffffff50);
    uVar3 = QString::size(&local_70);
    QString::~QString((QString *)0x7b2641);
    if (0 < (long)uVar3) {
      in_stack_ffffffffffffff30 = &pQVar2->groupPrefix;
      qVar4 = QString::size(in_stack_ffffffffffffff30);
      QString::truncate(in_stack_ffffffffffffff30,(char *)(~uVar3 + qVar4),__length);
    }
    bVar1 = QSettingsGroup::isArray(&local_58);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff30,
                 (char *)CONCAT17(bVar1,in_stack_ffffffffffffff28),in_stack_ffffffffffffff24,
                 (char *)in_stack_ffffffffffffff18);
      QMessageLogger::warning(&local_90,"QSettings::endGroup: Expected endArray() instead");
    }
    QSettingsGroup::~QSettingsGroup((QSettingsGroup *)0x7b26f7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSettings::endGroup()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endGroup: No matching beginGroup()");
        return;
    }

    QSettingsGroup group = d->groupStack.pop();
    qsizetype len = group.toString().size();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.isArray())
        qWarning("QSettings::endGroup: Expected endArray() instead");
}